

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris.c
# Opt level: O0

GList * get_playing_players(void)

{
  GList *pGVar1;
  gboolean gVar2;
  GList *next;
  GList *elem;
  GList *players;
  
  elem = get_all_players();
  pGVar1 = elem;
  while (next = pGVar1, next != (GList *)0x0) {
    pGVar1 = next->next;
    gVar2 = is_player_playing((gchar *)next->data);
    if (gVar2 == 0) {
      elem = (GList *)g_list_delete_link(elem,next);
    }
  }
  return elem;
}

Assistant:

GList*
get_playing_players()
{
  GList* players = get_all_players();
  GList* elem = players;
  while (elem != NULL) {
    GList* next = elem->next;
    if (!is_player_playing(elem->data)) {
      players = g_list_delete_link(players, elem);
    }
    elem = next;
  }
  return players;
}